

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv__try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  uv_handle_type uVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long unaff_R15;
  uv__cmsg cmsg;
  msghdr msg;
  undefined8 local_168;
  undefined8 local_160;
  int local_158;
  msghdr local_68;
  
  uVar2 = uv__getiovmax();
  if ((int)uVar2 < (int)nbufs) {
    nbufs = uVar2;
  }
  if (send_handle == (uv_stream_t *)0x0) {
    do {
      iVar6 = (stream->io_watcher).fd;
      if (nbufs == 1) {
        unaff_R15 = write(iVar6,bufs->base,bufs->len);
      }
      else {
        unaff_R15 = writev(iVar6,(iovec *)bufs,nbufs);
      }
      if (unaff_R15 != -1) goto LAB_0012107e;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    unaff_R15 = -1;
    goto LAB_0012107e;
  }
  uVar2 = send_handle->flags;
  if ((uVar2 & 3) == 0) {
    uVar1 = send_handle->type;
    lVar3 = 0x98;
    if ((uVar1 == UV_NAMED_PIPE) || (uVar1 == UV_TCP)) {
LAB_00120f9d:
      iVar6 = *(int *)((long)&send_handle->data + lVar3);
    }
    else {
      iVar6 = -1;
      if (uVar1 == UV_UDP) {
        lVar3 = 0x90;
        goto LAB_00120f9d;
      }
    }
    memset(&local_168,0,0x100);
    if (iVar6 < 0) {
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x317,
                    "int uv__try_write(uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *)"
                   );
    }
    local_68.msg_name = (void *)0x0;
    local_68.msg_namelen = 0;
    local_68.msg_iovlen = (size_t)(int)nbufs;
    local_68.msg_flags = 0;
    local_68.msg_controllen = 0x18;
    local_160 = 0x100000001;
    local_168 = 0x14;
    local_158 = iVar6;
    local_68.msg_iov = (iovec *)bufs;
    local_68.msg_control = &local_168;
    do {
      unaff_R15 = sendmsg((stream->io_watcher).fd,&local_68,0);
      if (unaff_R15 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  if ((uVar2 & 3) != 0) {
    return -9;
  }
LAB_0012107e:
  if (unaff_R15 < 0) {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    iVar5 = -0xb;
    if ((iVar6 != 0xb) && (iVar6 != 0x69)) {
      iVar5 = -iVar6;
    }
  }
  else {
    iVar5 = (int)unaff_R15;
  }
  return iVar5;
}

Assistant:

static int uv__try_write(uv_stream_t* stream,
                         const uv_buf_t bufs[],
                         unsigned int nbufs,
                         uv_stream_t* send_handle) {
  struct iovec* iov;
  int iovmax;
  int iovcnt;
  ssize_t n;

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  iov = (struct iovec*) bufs;
  iovcnt = nbufs;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */
  if (send_handle != NULL) {
    int fd_to_send;
    struct msghdr msg;
    union uv__cmsg cmsg;

    if (uv__is_closing(send_handle))
      return UV_EBADF;

    fd_to_send = uv__handle_fd((uv_handle_t*) send_handle);

    memset(&cmsg, 0, sizeof(cmsg));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &cmsg.hdr;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg.hdr.cmsg_level = SOL_SOCKET;
    cmsg.hdr.cmsg_type = SCM_RIGHTS;
    cmsg.hdr.cmsg_len = CMSG_LEN(sizeof(fd_to_send));
    memcpy(CMSG_DATA(&cmsg.hdr), &fd_to_send, sizeof(fd_to_send));

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && errno == EINTR);
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && errno == EINTR);
  }

  if (n >= 0)
    return n;

  if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
    return UV_EAGAIN;

#ifdef __APPLE__
  /* macOS versions 10.10 and 10.15 - and presumbaly 10.11 to 10.14, too -
   * have a bug where a race condition causes the kernel to return EPROTOTYPE
   * because the socket isn't fully constructed. It's probably the result of
   * the peer closing the connection and that is why libuv translates it to
   * ECONNRESET. Previously, libuv retried until the EPROTOTYPE error went
   * away but some VPN software causes the same behavior except the error is
   * permanent, not transient, turning the retry mechanism into an infinite
   * loop. See https://github.com/libuv/libuv/pull/482.
   */
  if (errno == EPROTOTYPE)
    return UV_ECONNRESET;
#endif  /* __APPLE__ */

  return UV__ERR(errno);
}